

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

int arm_current_el(CPUARMState_conflict *env)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  byte local_19;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_feature(env,9);
  if (iVar2 == 0) {
    _Var1 = is_a64(env);
    if (_Var1) {
      env_local._4_4_ = extract32(env->pstate,2,2);
    }
    else {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        env_local._4_4_ = 0;
      }
      else if (uVar3 == 0x16) {
        env_local._4_4_ = 3;
      }
      else if (uVar3 == 0x1a) {
        env_local._4_4_ = 2;
      }
      else {
        _Var1 = arm_is_secure(env);
        if ((!_Var1) || (_Var1 = arm_el_is_aa64(env,3), _Var1)) {
          env_local._4_4_ = 1;
        }
        else {
          env_local._4_4_ = 3;
        }
      }
    }
  }
  else {
    _Var1 = arm_v7m_is_handler_mode(env);
    local_19 = 1;
    if (!_Var1) {
      local_19 = ((env->v7m).control[(env->v7m).secure] & 1) != 0 ^ 0xff;
    }
    env_local._4_4_ = (uint)(local_19 & 1);
  }
  return env_local._4_4_;
}

Assistant:

static inline int arm_current_el(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_M)) {
        return arm_v7m_is_handler_mode(env) ||
            !(env->v7m.control[env->v7m.secure] & 1);
    }

    if (is_a64(env)) {
        return extract32(env->pstate, 2, 2);
    }

    switch (env->uncached_cpsr & 0x1f) {
    case ARM_CPU_MODE_USR:
        return 0;
    case ARM_CPU_MODE_HYP:
        return 2;
    case ARM_CPU_MODE_MON:
        return 3;
    default:
        if (arm_is_secure(env) && !arm_el_is_aa64(env, 3)) {
            /* If EL3 is 32-bit then all secure privileged modes run in
             * EL3
             */
            return 3;
        }

        return 1;
    }
}